

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O3

adjusted_mantissa
duckdb_fast_float::parse_long_mantissa<duckdb_fast_float::binary_format<double>>
          (char *first,char *last)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  byte *pbVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  adjusted_mantissa aVar15;
  decimal answer;
  decimal local_320;
  
  local_320.negative = *first == '-';
  local_320.truncated = false;
  pbVar8 = (byte *)(first + local_320.negative);
  pbVar9 = pbVar8;
  for (; (pbVar8 != (byte *)last && (pbVar9 = pbVar8, *pbVar8 == 0x30)); pbVar8 = pbVar8 + 1) {
    pbVar9 = (byte *)last;
  }
  if (pbVar9 == (byte *)last) {
    local_320.num_digits = 0;
  }
  else {
    uVar13 = 0;
    do {
      bVar1 = pbVar9[uVar13] - 0x30;
      uVar12 = (uint)uVar13;
      if (9 < bVar1) {
        local_320._0_8_ = uVar13 & 0xffffffff;
        if (pbVar9[uVar13] != 0x2e) {
          pbVar8 = pbVar9 + uVar13;
          uVar3 = uVar12;
          goto LAB_00295ad4;
        }
        pbVar6 = pbVar9 + uVar13 + 1;
        pbVar8 = pbVar6;
        if ((uVar12 != 0) || (pbVar6 == (byte *)last)) goto LAB_00295ba0;
        goto LAB_00295b90;
      }
      if (uVar12 < 0x300) {
        local_320.digits[uVar13 & 0xffffffff] = bVar1;
      }
      lVar2 = uVar13 + 1;
      uVar13 = uVar13 + 1;
    } while (pbVar9 + lVar2 != (byte *)last);
    pbVar9 = pbVar9 + uVar13;
    local_320.num_digits = (uint32_t)uVar13;
  }
  local_320.decimal_point = 0;
  pbVar8 = pbVar9;
  uVar3 = local_320.num_digits;
LAB_00295ad4:
  iVar11 = 0;
  goto LAB_00295ad7;
  while (pbVar6 = pbVar6 + 1, pbVar8 = (byte *)last, pbVar6 != (byte *)last) {
LAB_00295b90:
    pbVar8 = pbVar6;
    if (*pbVar6 != 0x30) break;
  }
LAB_00295ba0:
  if (last < pbVar8 + 8 || 0x2ff < (uint)(uVar13 + 8)) {
    uVar4 = uVar13 & 0xffffffff;
  }
  else {
    uVar4 = uVar13 & 0xffffffff;
    uVar13 = uVar13 + 8 & 0xffffffff;
    while (uVar10 = *(long *)pbVar8 + 0xcfcfcfcfcfcfcfd0,
          ((*(long *)pbVar8 + 0x4646464646464646U | uVar10) & 0x8080808080808080) == 0) {
      *(ulong *)(local_320.digits + uVar4) = uVar10;
      pbVar6 = pbVar8 + 0x10;
      uVar4 = (ulong)((int)uVar4 + 8);
      pbVar8 = pbVar8 + 8;
      if ((last < pbVar6) || (bVar14 = 0x2f7 < uVar13, uVar13 = uVar13 + 8, bVar14)) break;
    }
  }
  for (; (uVar3 = (uint)uVar4, pbVar8 != (byte *)last && ((byte)(*pbVar8 - 0x30) < 10));
      pbVar8 = pbVar8 + 1) {
    if (uVar3 < 0x300) {
      local_320.digits[uVar4] = *pbVar8 - 0x30;
    }
    uVar4 = (ulong)(uVar3 + 1);
  }
  iVar11 = ((int)pbVar9 - (int)pbVar8) + uVar12 + 1;
  local_320.decimal_point = iVar11;
  local_320.num_digits = uVar3;
LAB_00295ad7:
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    iVar7 = 0;
    pbVar9 = pbVar8;
    while( true ) {
      pbVar9 = pbVar9 + -1;
      bVar1 = *pbVar9;
      if ((bVar1 != 0x30) && (bVar1 != 0x2e)) break;
      iVar7 = iVar7 + (uint)(bVar1 == 0x30);
    }
    iVar11 = iVar11 + uVar3;
    uVar3 = uVar3 - iVar7;
    local_320.decimal_point = iVar11;
    local_320.num_digits = uVar3;
    if (0x300 < uVar3) {
      local_320.truncated = true;
      local_320.num_digits = 0x300;
      uVar3 = 0x300;
    }
  }
  if ((pbVar8 == (byte *)last) || ((*pbVar8 | 0x20) != 0x65)) goto LAB_00295c8f;
  pbVar9 = pbVar8 + 1;
  iVar7 = 0;
  if (pbVar9 == (byte *)last) {
LAB_00295c40:
    bVar14 = false;
  }
  else {
    if (*pbVar9 != 0x2d) {
      if (*pbVar9 == 0x2b) {
        pbVar9 = pbVar8 + 2;
      }
      goto LAB_00295c40;
    }
    bVar14 = true;
    pbVar9 = pbVar8 + 2;
  }
  if (pbVar9 != (byte *)last) {
    iVar7 = 0;
    do {
      if (9 < (byte)(*pbVar9 - 0x30)) break;
      iVar5 = (uint)(byte)(*pbVar9 - 0x30) + iVar7 * 10;
      if (0xffff < iVar7) {
        iVar5 = iVar7;
      }
      iVar7 = iVar5;
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != (byte *)last);
  }
  iVar5 = -iVar7;
  if (!bVar14) {
    iVar5 = iVar7;
  }
  local_320.decimal_point = iVar11 + iVar5;
LAB_00295c8f:
  if (uVar3 < 0x13) {
    switchD_00569a20::default(local_320.digits + uVar3,0,(ulong)(0x13 - uVar3));
  }
  aVar15 = compute_float<duckdb_fast_float::binary_format<double>>(&local_320);
  return aVar15;
}

Assistant:

fastfloat_really_inline decimal parse_decimal(const char *p, const char *pend, const char decimal_separator = '.') noexcept {
  decimal answer;
  answer.num_digits = 0;
  answer.decimal_point = 0;
  answer.truncated = false;
  answer.negative = (*p == '-');
  if (*p == '-') { // C++17 20.19.3.(7.1) explicitly forbids '+' sign here
    ++p;
  }
  // skip leading zeroes
  while ((p != pend) && (*p == '0')) {
    ++p;
  }
  while ((p != pend) && is_integer(*p)) {
    if (answer.num_digits < max_digits) {
      answer.digits[answer.num_digits] = uint8_t(*p - '0');
    }
    answer.num_digits++;
    ++p;
  }
  if ((p != pend) && (*p == decimal_separator)) {
    ++p;
    const char *first_after_period = p;
    // if we have not yet encountered a zero, we have to skip it as well
    if(answer.num_digits == 0) {
      // skip zeros
      while ((p != pend) && (*p == '0')) {
       ++p;
      }
    }
    // We expect that this loop will often take the bulk of the running time
    // because when a value has lots of digits, these digits often
    while ((p + 8 <= pend) && (answer.num_digits + 8 < max_digits)) {
      uint64_t val = read_u64(p);
      if(! is_made_of_eight_digits_fast(val)) { break; }
      // We have eight digits, process them in one go!
      val -= 0x3030303030303030;
      write_u64(answer.digits + answer.num_digits, val);
      answer.num_digits += 8;
      p += 8;
    }
    while ((p != pend) && is_integer(*p)) {
      if (answer.num_digits < max_digits) {
        answer.digits[answer.num_digits] = uint8_t(*p - '0');
      }
      answer.num_digits++;
      ++p;
    }
    answer.decimal_point = int32_t(first_after_period - p);
  }
  // We want num_digits to be the number of significant digits, excluding
  // leading *and* trailing zeros! Otherwise the truncated flag later is
  // going to be misleading.
  if(answer.num_digits > 0) {
    // We potentially need the answer.num_digits > 0 guard because we
    // prune leading zeros. So with answer.num_digits > 0, we know that
    // we have at least one non-zero digit.
    const char *preverse = p - 1;
    int32_t trailing_zeros = 0;
    while ((*preverse == '0') || (*preverse == decimal_separator)) {
      if(*preverse == '0') { trailing_zeros++; };
      --preverse;
    }
    answer.decimal_point += int32_t(answer.num_digits);
    answer.num_digits -= uint32_t(trailing_zeros);
  }
  if(answer.num_digits > max_digits) {
    answer.truncated = true;
    answer.num_digits = max_digits;
  }
  if ((p != pend) && (('e' == *p) || ('E' == *p))) {
    ++p;
    bool neg_exp = false;
    if ((p != pend) && ('-' == *p)) {
      neg_exp = true;
      ++p;
    } else if ((p != pend) && ('+' == *p)) { // '+' on exponent is allowed by C++17 20.19.3.(7.1)
      ++p;
    }
    int32_t exp_number = 0; // exponential part
    while ((p != pend) && is_integer(*p)) {
      uint8_t digit = uint8_t(*p - '0');
      if (exp_number < 0x10000) {
        exp_number = 10 * exp_number + digit;
      }
      ++p;
    }
    answer.decimal_point += (neg_exp ? -exp_number : exp_number);
  }
  // In very rare cases, we may have fewer than 19 digits, we want to be able to reliably
  // assume that all digits up to max_digit_without_overflow have been initialized.
  for(uint32_t i = answer.num_digits; i < max_digit_without_overflow; i++) { answer.digits[i] = 0; }

  return answer;
}